

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::writeConversion
          (CompilerMain *this,Reader reader,OutputStream *output)

{
  OutputStream *elementCount;
  CapTableReader *pCVar1;
  void *__buf;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  OutputStream reader_00;
  SegmentReader *pSVar5;
  uint *puVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  word *ptrCopy;
  ArrayPtr<capnp::word> uncheckedBuffer;
  ArrayPtr<capnp::word> uncheckedBuffer_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  MessageSizeCounts MVar11;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar12;
  TextCodec codec;
  MallocMessageBuilder message;
  PointerBuilder local_198;
  StructReader local_178;
  Builder local_140;
  undefined1 local_128 [248];
  
  if (JSON < this->convertTo) {
    kj::_::unreachable();
  }
  puVar6 = &switchD_00120c27::switchdataD_002015b0;
  switch(this->convertTo) {
  case BINARY:
    uVar2 = this->segmentSize;
    uVar9 = 0x400;
    if (uVar2 != 0) {
      uVar9 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_128,uVar9,uVar2 == 0);
    MessageBuilder::getRootInternal(&local_140,(MessageBuilder *)local_128);
    local_178.dataSize = reader._reader.dataSize;
    local_178.pointerCount = reader._reader.pointerCount;
    local_178._38_2_ = reader._reader._38_2_;
    local_178.nestingLimit = reader._reader.nestingLimit;
    local_178._44_4_ = reader._reader._44_4_;
    local_178.data = reader._reader.data;
    local_178.pointers = reader._reader.pointers;
    local_178.segment = reader._reader.segment;
    local_178.capTable = reader._reader.capTable;
    local_198.pointer = local_140.builder.pointer;
    local_198.segment = local_140.builder.segment;
    local_198.capTable = local_140.builder.capTable;
    capnp::_::PointerBuilder::setStruct(&local_198,&local_178,false);
    AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_128);
    AVar12.ptr = (ArrayPtr<const_capnp::word> *)AVar10.size_;
    AVar12.size_ = (size_t)puVar6;
    writeMessage((capnp *)output,(OutputStream *)AVar10.ptr,AVar12);
    goto LAB_00120ef6;
  case PACKED:
    uVar2 = this->segmentSize;
    uVar9 = 0x400;
    if (uVar2 != 0) {
      uVar9 = uVar2;
    }
    MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_128,uVar9,uVar2 == 0);
    MessageBuilder::getRootInternal(&local_140,(MessageBuilder *)local_128);
    local_178.dataSize = reader._reader.dataSize;
    local_178.pointerCount = reader._reader.pointerCount;
    local_178._38_2_ = reader._reader._38_2_;
    local_178.nestingLimit = reader._reader.nestingLimit;
    local_178._44_4_ = reader._reader._44_4_;
    local_178.data = reader._reader.data;
    local_178.pointers = reader._reader.pointers;
    local_178.segment = reader._reader.segment;
    local_178.capTable = reader._reader.capTable;
    local_198.pointer = local_140.builder.pointer;
    local_198.segment = local_140.builder.segment;
    local_198.capTable = local_140.builder.capTable;
    capnp::_::PointerBuilder::setStruct(&local_198,&local_178,false);
    AVar12 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_128);
    AVar10.ptr = (ArrayPtr<const_capnp::word> *)AVar12.size_;
    AVar10.size_ = (size_t)puVar6;
    writePackedMessage((capnp *)output,(OutputStream *)AVar12.ptr,AVar10);
LAB_00120ef6:
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_128);
    break;
  case FLAT:
    MVar11 = capnp::_::StructReader::totalSize(&reader._reader);
    elementCount = (OutputStream *)(MVar11.wordCount + 1);
    sVar7 = 0;
    reader_00._vptr_OutputStream =
         (_func_int **)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_128._16_8_ = &kj::_::HeapArrayDisposer::instance;
    sVar8 = MVar11.wordCount * 8 + 8;
    local_128._0_8_ = reader_00._vptr_OutputStream;
    local_128._8_8_ = elementCount;
    memset(reader_00._vptr_OutputStream,0,sVar8);
    uncheckedBuffer.size_ = sVar7;
    uncheckedBuffer.ptr = (word *)elementCount;
    copyToUnchecked<capnp::AnyStruct::Reader&>
              ((capnp *)&reader._reader,(Reader *)reader_00._vptr_OutputStream,uncheckedBuffer);
    (*output->_vptr_OutputStream[2])(output,reader_00._vptr_OutputStream,sVar8);
    if ((Reader *)reader_00._vptr_OutputStream != (Reader *)0x0) {
      local_128._0_8_ = (_func_int **)0x0;
      local_128._8_8_ = (OutputStream *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,
                 reader_00._vptr_OutputStream,8,(size_t)elementCount,(size_t)elementCount,
                 (_func_void_void_ptr *)0x0);
    }
    break;
  case FLAT_PACKED:
    MVar11 = capnp::_::StructReader::totalSize(&reader._reader);
    pCVar1 = (CapTableReader *)(MVar11.wordCount + 1);
    sVar7 = 0;
    pSVar5 = (SegmentReader *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (8,(size_t)pCVar1,(size_t)pCVar1,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    local_178.data = &kj::_::HeapArrayDisposer::instance;
    __buf = (void *)(MVar11.wordCount * 8 + 8);
    local_178.segment = pSVar5;
    local_178.capTable = pCVar1;
    memset(pSVar5,0,(size_t)__buf);
    uncheckedBuffer_00.size_ = sVar7;
    uncheckedBuffer_00.ptr = (word *)pCVar1;
    copyToUnchecked<capnp::AnyStruct::Reader&>
              ((capnp *)&reader._reader,(Reader *)pSVar5,uncheckedBuffer_00);
    sVar8 = 0;
    kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_128,output,(ArrayPtr<unsigned_char>)ZEXT816(0));
    capnp::_::PackedOutputStream::PackedOutputStream
              ((PackedOutputStream *)&local_198,(BufferedOutputStream *)local_128);
    capnp::_::PackedOutputStream::write((PackedOutputStream *)&local_198,(int)pSVar5,__buf,sVar8);
    capnp::_::PackedOutputStream::~PackedOutputStream((PackedOutputStream *)&local_198);
    kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_128);
    if (pSVar5 != (SegmentReader *)0x0) {
      local_178.segment = (SegmentReader *)0x0;
      local_178.capTable = (CapTableReader *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar5,8,(size_t)pCVar1,
                 (size_t)pCVar1,(_func_void_void_ptr *)0x0);
    }
    break;
  case CANONICAL:
    capnp::_::StructReader::canonicalize((Array<capnp::word> *)local_128,&reader._reader);
    (*output->_vptr_OutputStream[2])(output,local_128._0_8_,local_128._8_8_ << 3);
    uVar4 = local_128._8_8_;
    uVar3 = local_128._0_8_;
    if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
      local_128._0_8_ = (_func_int **)0x0;
      local_128._8_8_ = (OutputStream *)0x0;
      (*(code *)(*(Arena **)local_128._16_8_)->_vptr_Arena)(local_128._16_8_,uVar3,8,uVar4,uVar4,0);
    }
    break;
  case TEXT:
    TextCodec::TextCodec((TextCodec *)&local_198);
    TextCodec::setPrettyPrint((TextCodec *)&local_198,this->pretty);
    local_128._8_8_ = (this->rootType).super_Schema.raw;
    local_128._48_4_ = reader._reader.dataSize;
    local_128._52_2_ = reader._reader.pointerCount;
    local_128._54_2_ = reader._reader._38_2_;
    local_128._56_8_ = reader._reader._40_8_;
    local_128._32_8_ = reader._reader.data;
    local_128._40_8_ = reader._reader.pointers;
    local_128._16_8_ = reader._reader.segment;
    local_128._24_8_ = reader._reader.capTable;
    local_128._0_4_ = 10;
    TextCodec::encode((String *)&local_178,(TextCodec *)&local_198,(Reader *)local_128);
    DynamicValue::Reader::~Reader((Reader *)local_128);
    local_128._8_8_ = (OutputStream *)0x0;
    if (local_178.capTable != (CapTableReader *)0x0) {
      local_128._8_8_ = (OutputStream *)((long)&local_178.capTable[-1]._vptr_CapTableReader + 7);
    }
    local_128._16_8_ = &kj::_::ByteLiteral<2ul>;
    local_128._24_8_ = (SegmentReader *)0x1;
    (*output->_vptr_OutputStream[3])(output,local_128,2);
    pCVar1 = local_178.capTable;
    pSVar5 = local_178.segment;
    if (local_178.segment != (SegmentReader *)0x0) {
      local_178.segment = (SegmentReader *)0x0;
      local_178.capTable = (CapTableReader *)0x0;
      (*(code *)**local_178.data)(local_178.data,pSVar5,1,pCVar1,pCVar1,0);
    }
    TextCodec::~TextCodec((TextCodec *)&local_198);
    break;
  case JSON:
    JsonCodec::JsonCodec((JsonCodec *)&local_198);
    JsonCodec::setPrettyPrint((JsonCodec *)&local_198,this->pretty);
    JsonCodec::handleByAnnotation((JsonCodec *)&local_198,(this->rootType).super_Schema.raw);
    local_128._0_8_ = (this->rootType).super_Schema.raw;
    local_128._40_4_ = reader._reader.dataSize;
    local_128._44_2_ = reader._reader.pointerCount;
    local_128._46_2_ = reader._reader._38_2_;
    local_128._48_8_ = reader._reader._40_8_;
    local_128._24_8_ = reader._reader.data;
    local_128._32_8_ = reader._reader.pointers;
    local_128._8_8_ = reader._reader.segment;
    local_128._16_8_ = reader._reader.capTable;
    JsonCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)&local_178,(JsonCodec *)&local_198,(Reader *)local_128);
    local_128._8_8_ = (OutputStream *)0x0;
    if (local_178.capTable != (CapTableReader *)0x0) {
      local_128._8_8_ = (OutputStream *)((long)&local_178.capTable[-1]._vptr_CapTableReader + 7);
    }
    local_128._16_8_ = &kj::_::ByteLiteral<2ul>;
    local_128._24_8_ = (SegmentReader *)0x1;
    (*output->_vptr_OutputStream[3])(output,local_128,2);
    pCVar1 = local_178.capTable;
    pSVar5 = local_178.segment;
    if (local_178.segment != (SegmentReader *)0x0) {
      local_178.segment = (SegmentReader *)0x0;
      local_178.capTable = (CapTableReader *)0x0;
      (*(code *)**local_178.data)(local_178.data,pSVar5,1,pCVar1,pCVar1,0);
    }
    JsonCodec::~JsonCodec((JsonCodec *)&local_198);
  }
  return;
}

Assistant:

void writeConversion(AnyStruct::Reader reader, kj::OutputStream& output) {
    switch (convertTo) {
      case Format::BINARY: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writeMessage(output, message);
        return;
      }
      case Format::PACKED: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writePackedMessage(output, message);
        return;
      }
      case Format::FLAT: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        output.write(words.asBytes());
        return;
      }
      case Format::FLAT_PACKED: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        kj::BufferedOutputStreamWrapper buffered(output);
        capnp::_::PackedOutputStream packed(buffered);
        packed.write(words.asBytes());
        return;
      }
      case Format::CANONICAL: {
        auto words = reader.canonicalize();
        output.write(words.asBytes());
        return;
      }
      case Format::TEXT: {
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
      case Format::JSON: {
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
    }

    KJ_UNREACHABLE;
  }